

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeanUpdater_impl.hpp
# Opt level: O0

void __thiscall
hiberlite::UpdateBean::notifyInitWalk<hiberlite::AVisitor<hiberlite::UpdateBean>>
          (UpdateBean *this,AVisitor<hiberlite::UpdateBean> *av)

{
  sqlid_t rowid;
  Scope local_80;
  undefined1 local_38 [40];
  AVisitor<hiberlite::UpdateBean> *av_local;
  UpdateBean *this_local;
  
  local_38._32_8_ = av;
  av_local = (AVisitor<hiberlite::UpdateBean> *)this;
  AVisitor<hiberlite::UpdateBean>::getScope(&local_80,av);
  Scope::table_abi_cxx11_((Scope *)local_38);
  rowid = AVisitor<hiberlite::UpdateBean>::getRootId
                    ((AVisitor<hiberlite::UpdateBean> *)local_38._32_8_);
  startRow(this,(string *)local_38,rowid,-1,0);
  std::__cxx11::string::~string((string *)local_38);
  Scope::~Scope(&local_80);
  return;
}

Assistant:

void UpdateBean::notifyInitWalk(AV& av)
{
	startRow(av.getScope().table(), av.getRootId(), Database::NULL_ID,0);
}